

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O2

Move * ddSymmSiftingDown(DdManager *table,int x,int xHigh)

{
  int x_00;
  uint uVar1;
  uint uVar2;
  DdHalfWord DVar3;
  DdHalfWord DVar4;
  DdSubtable *pDVar5;
  int iVar6;
  DdHalfWord y;
  int iVar7;
  DdNode *pDVar8;
  long lVar9;
  DdHalfWord x_01;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int local_74;
  int local_68;
  DdNode *local_58;
  int local_4c;
  double local_48;
  long local_40;
  long local_38;
  
  local_58 = (DdNode *)0x0;
  x_00 = table->invperm[x];
  uVar1 = table->subtables[x].next;
  uVar2 = table->keys;
  iVar11 = table->isolated;
  lVar14 = (long)xHigh;
  lVar13 = lVar14 * 0xe + 4;
  local_74 = 0;
  local_4c = xHigh;
  for (; (int)uVar1 < lVar14; lVar14 = lVar14 + -1) {
    iVar7 = table->invperm[lVar14];
    if ((iVar7 == x_00) || (iVar6 = cuddTestInteract(table,x_00,iVar7), iVar6 != 0)) {
      local_74 = (local_74 - (uint)(table->vars[iVar7]->ref == 1)) +
                 *(int *)((long)&table->subtables->nodelist + lVar13 * 4);
    }
    lVar13 = lVar13 + -0xe;
  }
  iVar11 = uVar2 - iVar11;
  y = cuddNextHigh(table,x);
  local_68 = iVar11;
  do {
    if (local_4c < (int)y) {
      return (Move *)local_58;
    }
    if (local_68 <= iVar11 - local_74) {
      return (Move *)local_58;
    }
    pDVar5 = table->subtables;
    local_38 = (long)(int)y;
    local_40 = local_38 * 0x38;
    DVar3 = pDVar5[local_38].next;
    DVar4 = DVar3;
    do {
      x_01 = DVar4;
      lVar13 = (long)(int)x_01;
      DVar4 = pDVar5[lVar13].next;
    } while (pDVar5[lVar13].next != y);
    iVar7 = cuddSymmCheck(table,x,y);
    DVar4 = pDVar5[x].next;
    if (iVar7 == 0) {
      local_48 = (double)local_68;
      if ((DVar4 != x) || (DVar3 != y)) {
        lVar14 = (long)(int)DVar4;
        lVar12 = lVar14 * 0xe + 0x12;
        do {
          iVar11 = table->invperm[lVar14 + 1];
          if ((iVar11 == x_00) || (iVar7 = cuddTestInteract(table,x_00,iVar11), iVar7 != 0)) {
            local_74 = (local_74 + (uint)(table->vars[iVar11]->ref == 1)) -
                       *(int *)((long)&table->subtables->nodelist + lVar12 * 4);
          }
          lVar14 = lVar14 + 1;
          lVar12 = lVar12 + 0xe;
        } while (lVar14 < lVar13);
        iVar11 = ddSymmGroupMove(table,x,y,(Move **)&local_58);
        if (iVar11 != 0) {
          if (local_48 * table->maxGrowth < (double)iVar11) {
            return (Move *)local_58;
          }
          lVar14 = (long)(int)table->subtables[lVar13].next;
          do {
            lVar12 = lVar14 * 0xe + 0x12;
            do {
              lVar10 = lVar12;
              lVar9 = lVar14;
              if (lVar13 <= lVar9) goto LAB_007448b3;
              iVar7 = table->invperm[lVar9 + 1];
              if (iVar7 == x_00) break;
              iVar6 = cuddTestInteract(table,x_00,iVar7);
              lVar14 = lVar9 + 1;
              lVar12 = lVar10 + 0xe;
            } while (iVar6 == 0);
            local_74 = (local_74 - (uint)(table->vars[iVar7]->ref == 1)) +
                       *(int *)((long)&table->subtables->nodelist + lVar10 * 4);
            lVar14 = lVar9 + 1;
          } while( true );
        }
LAB_00744a28:
        while (local_58 != (DdNode *)0x0) {
          pDVar8 = (local_58->type).kids.T;
          local_58->ref = 0;
          local_58->next = table->nextFree;
          table->nextFree = local_58;
          local_58 = pDVar8;
        }
        return (Move *)0x1;
      }
      iVar11 = table->invperm[local_38];
      iVar7 = cuddTestInteract(table,x_00,iVar11);
      if (iVar7 != 0) {
        local_74 = (local_74 + (uint)(table->vars[iVar11]->ref == 1)) -
                   *(int *)((long)&table->subtables->keys + local_40);
      }
      iVar11 = cuddSwapInPlace(table,x,y);
      if ((iVar11 == 0) || (pDVar8 = cuddDynamicAllocNode(table), pDVar8 == (DdNode *)0x0))
      goto LAB_00744a28;
      pDVar8->index = x;
      pDVar8->ref = y;
      *(int *)((long)&pDVar8->next + 4) = iVar11;
      (pDVar8->type).kids.T = local_58;
      local_58 = pDVar8;
      if (local_48 * table->maxGrowth < (double)iVar11) {
        return (Move *)pDVar8;
      }
LAB_007448b3:
      if (iVar11 < local_68) {
        local_68 = iVar11;
      }
    }
    else {
      pDVar5[x].next = y;
      pDVar5[lVar13].next = DVar4;
    }
    y = cuddNextHigh(table,x_01);
    x = x_01;
  } while( true );
}

Assistant:

static Move *
ddSymmSiftingDown(
  DdManager * table,
  int  x,
  int  xHigh)
{
    Move *moves;
    Move *move;
    int  y;
    int  size;
    int  limitSize;
    int  gxtop,gybot;
    int  R;     /* upper bound on node decrease */
    int  xindex, yindex;
    int  isolated;
    int  z;
    int  zindex;
#ifdef DD_DEBUG
    int  checkR;
#endif

    moves = NULL;
    /* Initialize R */
    xindex = table->invperm[x];
    gxtop = table->subtables[x].next;
    limitSize = size = table->keys - table->isolated;
    R = 0;
    for (z = xHigh; z > gxtop; z--) {
        zindex = table->invperm[z];
        if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
            isolated = table->vars[zindex]->ref == 1;
            R += table->subtables[z].keys - isolated;
        }
    }

    y = cuddNextHigh(table,x);
    while (y <= xHigh && size - R < limitSize) {
#ifdef DD_DEBUG
        gxtop = table->subtables[x].next;
        checkR = 0;
        for (z = xHigh; z > gxtop; z--) {
            zindex = table->invperm[z];
            if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkR += table->subtables[z].keys - isolated;
            }
        }
        assert(R == checkR);
#endif
        gybot = table->subtables[y].next;
        while (table->subtables[gybot].next != (unsigned) y)
            gybot = table->subtables[gybot].next;
        if (cuddSymmCheck(table,x,y)) {
            /* Symmetry found, attach symm groups */
            gxtop = table->subtables[x].next;
            table->subtables[x].next = y;
            table->subtables[gybot].next = gxtop;
        } else if (table->subtables[x].next == (unsigned) x &&
                   table->subtables[y].next == (unsigned) y) {
            /* x and y have self symmetry */
            /* Update upper bound on node decrease. */
            yindex = table->invperm[y];
            if (cuddTestInteract(table,xindex,yindex)) {
                isolated = table->vars[yindex]->ref == 1;
                R -= table->subtables[y].keys - isolated;
            }
            size = cuddSwapInPlace(table,x,y);
#ifdef DD_DEBUG
            assert(table->subtables[x].next == (unsigned) x);
            assert(table->subtables[y].next == (unsigned) y);
#endif
            if (size == 0) goto ddSymmSiftingDownOutOfMem;
            move = (Move *) cuddDynamicAllocNode(table);
            if (move == NULL) goto ddSymmSiftingDownOutOfMem;
            move->x = x;
            move->y = y;
            move->size = size;
            move->next = moves;
            moves = move;
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(moves);
            if (size < limitSize) limitSize = size;
        } else { /* Group move */
            /* Update upper bound on node decrease: first phase. */
            gxtop = table->subtables[x].next;
            z = gxtop + 1;
            do {
                zindex = table->invperm[z];
                if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
                    isolated = table->vars[zindex]->ref == 1;
                    R -= table->subtables[z].keys - isolated;
                }
                z++;
            } while (z <= gybot);
            size = ddSymmGroupMove(table,x,y,&moves);
            if (size == 0) goto ddSymmSiftingDownOutOfMem;
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(moves);
            if (size < limitSize) limitSize = size;
            /* Update upper bound on node decrease: second phase. */
            gxtop = table->subtables[gybot].next;
            for (z = gxtop + 1; z <= gybot; z++) {
                zindex = table->invperm[z];
                if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
                    isolated = table->vars[zindex]->ref == 1;
                    R += table->subtables[z].keys - isolated;
                }
            }
        }
        x = gybot;
        y = cuddNextHigh(table,x);
    }

    return(moves);

ddSymmSiftingDownOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(MV_OOM);

}